

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O2

int getstring(int *ip,char *buffer,int size)

{
  ushort *puVar1;
  int iVar2;
  ushort **ppuVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  
  ppuVar3 = __ctype_b_loc();
  puVar1 = *ppuVar3;
  iVar4 = *ip;
  pcVar5 = prlnbuf + iVar4;
  while (iVar4 = iVar4 + 1, (*(byte *)((long)puVar1 + (long)*pcVar5 * 2 + 1) & 0x20) != 0) {
    *ip = iVar4;
    pcVar5 = pcVar5 + 1;
  }
  *ip = iVar4;
  if (*pcVar5 == '\"') {
    uVar6 = 0;
    uVar7 = (ulong)(uint)size;
    if (size < 1) {
      uVar7 = uVar6;
    }
    pcVar5 = "String too long!";
    while( true ) {
      *ip = iVar4 + 1;
      if (prlnbuf[iVar4] == '\"') break;
      if (uVar7 == uVar6) goto LAB_00109c9d;
      buffer[uVar6] = prlnbuf[iVar4];
      uVar6 = uVar6 + 1;
      iVar4 = *ip;
    }
    buffer[uVar6] = '\0';
    puVar1 = *ppuVar3;
    iVar4 = *ip;
    pcVar5 = prlnbuf + iVar4;
    iVar2 = 1;
    while (iVar4 = iVar4 + 1, (*(byte *)((long)puVar1 + (long)*pcVar5 * 2 + 1) & 0x20) != 0) {
      *ip = iVar4;
      pcVar5 = pcVar5 + 1;
    }
  }
  else {
    pcVar5 = "Incorrect string syntax!";
LAB_00109c9d:
    error(pcVar5);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
getstring(int *ip, char *buffer, int size)
{
	char c;
	int i;

	/* skip spaces */
	while (isspace(prlnbuf[*ip]))
		(*ip)++;

	/* string must be enclosed */
	if (prlnbuf[(*ip)++] != '\"') {
		error("Incorrect string syntax!");
		return (0);
	}

	/* get string */
	i = 0;
	for (;;) {
		c = prlnbuf[(*ip)++];
		if (c == '\"')
			break;
		if (i >= size) {
			error("String too long!");
			return (0);
		}
		buffer[i++] = c;
	}

	/* end the string */
	buffer[i] = '\0';

	/* skip spaces */
	while (isspace(prlnbuf[*ip]))
		(*ip)++;

	/* ok */
	return (1);
}